

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void __thiscall absl::Mutex::LockSlowLoop(Mutex *this,SynchWaitParams *waitp,int flags)

{
  ulong uVar1;
  long *plVar2;
  MuHow pMVar3;
  long lVar4;
  uint uVar5;
  PerThreadSynch *pPVar6;
  GraphId id;
  SynchLocksHeld *held_locks;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  int ev;
  PerThreadSynch *head;
  ulong uVar7;
  PerThreadSynch *pPVar8;
  synchronization_internal *this_00;
  bool bVar9;
  
  head = (PerThreadSynch *)this;
  if (((this->mu_).super___atomic_base<long>._M_i & 0x10U) != 0) {
    PostSynchEvent(this,(uint)(waitp->how != (MuHow)kExclusiveS) * 2 + 4);
  }
  if ((waitp->thread->waitp == (SynchWaitParams *)0x0) ||
     (waitp->thread->suppress_fatal_errors != false)) {
    this_00 = (synchronization_internal *)0x0;
    do {
      pPVar8 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
      head = pPVar8;
      CheckForMutexCorruption((intptr_t)pPVar8,"Lock");
      pMVar3 = waitp->how;
      uVar7 = extraout_RDX;
      if ((pMVar3->slow_need_zero & (ulong)pPVar8) == 0) {
        LOCK();
        bVar9 = pPVar8 == (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
        if (bVar9) {
          (this->mu_).super___atomic_base<long>._M_i =
               ((-(ulong)((flags & 1U) == 0) | 0xfffffffffffffffd) & (ulong)pPVar8 | pMVar3->fast_or
               ) + pMVar3->fast_add;
        }
        UNLOCK();
        if (bVar9) {
LAB_00141152:
          head = (PerThreadSynch *)waitp->cond;
          if ((head == (PerThreadSynch *)0x0) ||
             (bVar9 = (**(_func_bool_Condition_ptr **)&head->may_skip)((Condition *)head), bVar9)) {
            if ((waitp->thread->waitp == (SynchWaitParams *)0x0) ||
               (waitp->thread->suppress_fatal_errors != false)) {
              if (((ulong)pPVar8 & 0x10) != 0) {
                PostSynchEvent(this,(uint)(waitp->how != (MuHow)kExclusiveS) * 2 + 5);
                return;
              }
              return;
            }
            goto LAB_00141208;
          }
          UnlockSlow(this,waitp);
LAB_0014116d:
          head = (PerThreadSynch *)this;
          Block(this,waitp->thread);
          flags = flags | 1;
          this_00 = (synchronization_internal *)0x0;
          uVar7 = extraout_RDX_00;
        }
      }
      else if (((ulong)pPVar8 & 0x44) == 0) {
        head = (PerThreadSynch *)0x0;
        pPVar6 = Enqueue((PerThreadSynch *)0x0,waitp,(intptr_t)pPVar8,flags);
        if (pPVar6 == (PerThreadSynch *)0x0) goto LAB_001411f9;
        uVar7 = (ulong)((uint)pPVar8 & (uint)((flags & 1U) == 0) * 2 + 0xb9);
        uVar1 = uVar7 + 4;
        uVar7 = uVar7 | 0x24;
        if (((ulong)pPVar8 & 1) == 0) {
          uVar7 = uVar1;
        }
        if (waitp->how != (MuHow)kExclusiveS) {
          uVar7 = uVar1;
        }
        uVar7 = uVar7 | (ulong)pPVar6;
        LOCK();
        bVar9 = pPVar8 == (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
        if (bVar9) {
          (this->mu_).super___atomic_base<long>._M_i = uVar7;
        }
        UNLOCK();
        if (bVar9) goto LAB_0014116d;
        waitp->thread->waitp = (SynchWaitParams *)0x0;
      }
      else if (((-(ulong)((flags & 1U) == 0) | 0xffffffffffffffdf) & pMVar3->slow_inc_need_zero &
               (ulong)pPVar8) == 0) {
        LOCK();
        bVar9 = pPVar8 == (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
        if (bVar9) {
          (this->mu_).super___atomic_base<long>._M_i =
               ((ulong)((uint)((flags & 1U) == 0) * 2) | 0xffffffffffffffbc) & (ulong)pPVar8 | 0x41;
        }
        UNLOCK();
        if (bVar9) {
          plVar2 = (long *)(((ulong)pPVar8 & 0xffffffffffffff00) + 0x28);
          *plVar2 = *plVar2 + 0x100;
          do {
            pPVar8 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
            LOCK();
            bVar9 = pPVar8 == (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
            if (bVar9) {
              (this->mu_).super___atomic_base<long>._M_i = ((ulong)pPVar8 & 0xffffffffffffffbe) + 1;
            }
            UNLOCK();
          } while (!bVar9);
          goto LAB_00141152;
        }
      }
      else if (((ulong)pPVar8 & 0x40) == 0) {
        LOCK();
        bVar9 = pPVar8 == (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
        if (bVar9) {
          (this->mu_).super___atomic_base<long>._M_i =
               ((ulong)((uint)((flags & 1U) == 0) * 2) | 0xffffffffffffffb9) & (ulong)pPVar8 | 0x44;
        }
        UNLOCK();
        if (bVar9) {
          head = (PerThreadSynch *)((ulong)pPVar8 & 0xffffffffffffff00);
          pPVar6 = Enqueue(head,waitp,(intptr_t)pPVar8,flags);
          if (pPVar6 != (PerThreadSynch *)0x0) {
            uVar7 = (ulong)(((uint)pPVar8 & 1) << 5);
            if (waitp->how != (MuHow)kExclusiveS) {
              uVar7 = 0;
            }
            do {
              lVar4 = (this->mu_).super___atomic_base<long>._M_i;
              LOCK();
              bVar9 = lVar4 == (this->mu_).super___atomic_base<long>._M_i;
              if (bVar9) {
                (this->mu_).super___atomic_base<long>._M_i =
                     (ulong)((uint)lVar4 & 0xbb) | uVar7 | (ulong)pPVar6 | 4;
              }
              UNLOCK();
            } while (!bVar9);
            goto LAB_0014116d;
          }
          goto LAB_001411fe;
        }
      }
      if ((waitp->thread->waitp != (SynchWaitParams *)0x0) &&
         (waitp->thread->suppress_fatal_errors == false)) goto LAB_001411f4;
      uVar5 = synchronization_internal::MutexDelay(this_00,1,(int)uVar7);
      this_00 = (synchronization_internal *)(ulong)uVar5;
    } while( true );
  }
LAB_00141203:
  LockSlowLoop();
LAB_00141208:
  LockSlowLoop();
  pPVar8 = head->next;
  ev = 1;
  if (((ulong)pPVar8 & 9) == 0) {
    LOCK();
    bVar9 = pPVar8 == head->next;
    if (bVar9) {
      head->next = (PerThreadSynch *)((ulong)pPVar8 | 8);
    }
    UNLOCK();
    if (bVar9) {
      if (_ZN4absl12_GLOBAL__N_124synch_deadlock_detectionE_0 != 0) {
        id = GetGraphId((Mutex *)head);
        held_locks = Synch_GetAllLocks();
        LockEnter((Mutex *)head,id,held_locks);
      }
      ev = 0;
    }
  }
  PostSynchEvent(head,ev);
  return;
LAB_001411f4:
  LockSlowLoop();
LAB_001411f9:
  LockSlowLoop();
LAB_001411fe:
  LockSlowLoop();
  goto LAB_00141203;
}

Assistant:

void Mutex::LockSlowLoop(SynchWaitParams* waitp, int flags) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  int c = 0;
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(
        this, waitp->how == kExclusive ? SYNCH_EV_LOCK : SYNCH_EV_READERLOCK);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  for (;;) {
    v = mu_.load(std::memory_order_relaxed);
    CheckForMutexCorruption(v, "Lock");
    if ((v & waitp->how->slow_need_zero) == 0) {
      if (mu_.compare_exchange_strong(
              v,
              (waitp->how->fast_or |
               (v & ClearDesignatedWakerMask(flags & kMuHasBlocked))) +
                  waitp->how->fast_add,
              std::memory_order_acquire, std::memory_order_relaxed)) {
        if (waitp->cond == nullptr ||
            EvalConditionAnnotated(waitp->cond, this, true, false,
                                   waitp->how == kShared)) {
          break;  // we timed out, or condition true, so return
        }
        this->UnlockSlow(waitp);  // got lock but condition false
        this->Block(waitp->thread);
        flags |= kMuHasBlocked;
        c = 0;
      }
    } else {  // need to access waiter list
      bool dowait = false;
      if ((v & (kMuSpin | kMuWait)) == 0) {  // no waiters
        // This thread tries to become the one and only waiter.
        PerThreadSynch* new_h = Enqueue(nullptr, waitp, v, flags);
        intptr_t nv =
            (v & ClearDesignatedWakerMask(flags & kMuHasBlocked) & kMuLow) |
            kMuWait;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to empty list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          nv |= kMuWrWait;
        }
        if (mu_.compare_exchange_strong(
                v, reinterpret_cast<intptr_t>(new_h) | nv,
                std::memory_order_release, std::memory_order_relaxed)) {
          dowait = true;
        } else {  // attempted Enqueue() failed
          // zero out the waitp field set by Enqueue()
          waitp->thread->waitp = nullptr;
        }
      } else if ((v & waitp->how->slow_inc_need_zero &
                  IgnoreWaitingWritersMask(flags & kMuHasBlocked)) == 0) {
        // This is a reader that needs to increment the reader count,
        // but the count is currently held in the last waiter.
        if (mu_.compare_exchange_strong(
                v,
                (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                    kMuSpin | kMuReader,
                std::memory_order_acquire, std::memory_order_relaxed)) {
          PerThreadSynch* h = GetPerThreadSynch(v);
          h->readers += kMuOne;  // inc reader count in waiter
          do {                   // release spinlock
            v = mu_.load(std::memory_order_relaxed);
          } while (!mu_.compare_exchange_weak(v, (v & ~kMuSpin) | kMuReader,
                                              std::memory_order_release,
                                              std::memory_order_relaxed));
          if (waitp->cond == nullptr ||
              EvalConditionAnnotated(waitp->cond, this, true, false,
                                     waitp->how == kShared)) {
            break;  // we timed out, or condition true, so return
          }
          this->UnlockSlow(waitp);  // got lock but condition false
          this->Block(waitp->thread);
          flags |= kMuHasBlocked;
          c = 0;
        }
      } else if ((v & kMuSpin) == 0 &&  // attempt to queue ourselves
                 mu_.compare_exchange_strong(
                     v,
                     (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                         kMuSpin | kMuWait,
                     std::memory_order_acquire, std::memory_order_relaxed)) {
        PerThreadSynch* h = GetPerThreadSynch(v);
        PerThreadSynch* new_h = Enqueue(h, waitp, v, flags);
        intptr_t wr_wait = 0;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          wr_wait = kMuWrWait;  // give priority to a waiting writer
        }
        do {  // release spinlock
          v = mu_.load(std::memory_order_relaxed);
        } while (!mu_.compare_exchange_weak(
            v,
            (v & (kMuLow & ~kMuSpin)) | kMuWait | wr_wait |
                reinterpret_cast<intptr_t>(new_h),
            std::memory_order_release, std::memory_order_relaxed));
        dowait = true;
      }
      if (dowait) {
        this->Block(waitp->thread);  // wait until removed from list or timeout
        flags |= kMuHasBlocked;
        c = 0;
      }
    }
    ABSL_RAW_CHECK(
        waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
        "detected illegal recursion into Mutex code");
    // delay, then try again
    c = synchronization_internal::MutexDelay(c, GENTLE);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(this, waitp->how == kExclusive
                             ? SYNCH_EV_LOCK_RETURNING
                             : SYNCH_EV_READERLOCK_RETURNING);
  }
}